

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O3

int iface_get_arptype(int fd,char *device,char *ebuf)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  char local_40 [15];
  undefined1 local_31;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  strncpy(local_40,device,0x10);
  local_31 = 0;
  iVar1 = ioctl(fd,0x8927,local_40);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    pcVar4 = pcap_strerror(*piVar3);
    snprintf(ebuf,0x100,"SIOCGIFHWADDR: %s",pcVar4);
    uVar2 = -(uint)(*piVar3 != 0x13) | 0xfffffffb;
  }
  else {
    uVar2 = (uint)(ushort)local_30;
  }
  return uVar2;
}

Assistant:

static int
iface_get_arptype(int fd, const char *device, char *ebuf)
{
	struct ifreq	ifr;

	memset(&ifr, 0, sizeof(ifr));
	strlcpy(ifr.ifr_name, device, sizeof(ifr.ifr_name));

	if (ioctl(fd, SIOCGIFHWADDR, &ifr) == -1) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			 "SIOCGIFHWADDR: %s", pcap_strerror(errno));
		if (errno == ENODEV) {
			/*
			 * No such device.
			 */
			return PCAP_ERROR_NO_SUCH_DEVICE;
		}
		return PCAP_ERROR;
	}

	return ifr.ifr_hwaddr.sa_family;
}